

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.h
# Opt level: O2

Diagnostic * __thiscall slang::Diagnostic::operator=(Diagnostic *this,Diagnostic *param_1)

{
  SourceLocation SVar1;
  bool bVar2;
  undefined7 uVar3;
  DiagCode DVar4;
  undefined4 uVar5;
  
  std::
  vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
  ::operator=(&this->args,&param_1->args);
  std::vector<slang::SourceRange,_std::allocator<slang::SourceRange>_>::operator=
            (&this->ranges,&param_1->ranges);
  std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::operator=
            (&this->notes,&param_1->notes);
  bVar2 = (param_1->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_engaged;
  uVar3 = *(undefined7 *)
           &(param_1->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>.field_0x9;
  DVar4 = param_1->code;
  uVar5 = *(undefined4 *)&param_1->field_0x5c;
  SVar1 = param_1->location;
  (this->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       (param_1->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  (this->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = bVar2;
  *(undefined7 *)
   &(this->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>.field_0x9 = uVar3;
  this->code = DVar4;
  *(undefined4 *)&this->field_0x5c = uVar5;
  this->location = SVar1;
  this->symbol = param_1->symbol;
  return this;
}

Assistant:

class SLANG_EXPORT Diagnostic {
public:
    using CustomArgType = std::pair<SLANG_TYPEINDEX, std::any>;

    // Diagnostic-specific arguments that can be used to better report messages.
    using Arg = std::variant<std::string, int64_t, uint64_t, char, ConstantValue, CustomArgType>;
    std::vector<Arg> args;
    std::vector<SourceRange> ranges;
    std::vector<Diagnostic> notes;
    std::optional<size_t> coalesceCount;

    /// The specific kind of diagnostic that was issued.
    DiagCode code;

    /// The location in source of the cause of the diagnostic.
    SourceLocation location;

    /// The symbol in which the diagnostic occurred, or null if not applicable.
    const ast::Symbol* symbol = nullptr;

    /// Default constructs a new Diagnostic entry.
    Diagnostic() noexcept;

    /// Constructs a new Diagnostic entry with the given code and location.
    Diagnostic(DiagCode code, SourceLocation location) noexcept;

    /// Constructs a new Diagnostic entry with the given symbol, code and location.
    Diagnostic(const ast::Symbol& source, DiagCode code, SourceLocation location) noexcept;

    /// Returns true if this diagnostic's code is intrinsically considered an error,
    /// regardless of what severity mapping rules might be in place.
    bool isError() const;

    /// Adds a new note to the diagnostic at the given source location.
    Diagnostic& addNote(DiagCode code, SourceLocation location);
    Diagnostic& addNote(DiagCode code, SourceRange range);
    Diagnostic& addNote(const Diagnostic& diag);

    /// Adds an argument to the diagnostic.
    Diagnostic& operator<<(const std::string& arg);
    Diagnostic& operator<<(std::string_view arg);
    Diagnostic& operator<<(SourceRange arg);
    Diagnostic& operator<<(const ConstantValue& arg);
    Diagnostic& operator<<(char arg);
    Diagnostic& operator<<(real_t arg);
    Diagnostic& operator<<(shortreal_t arg);

    Diagnostic& addStringAllowEmpty(const std::string& arg);

    template<std::signed_integral T>
    Diagnostic& operator<<(T arg) {
        args.emplace_back((int64_t)arg);
        return *this;
    }

    template<std::unsigned_integral T>
    Diagnostic& operator<<(T arg) {
        args.emplace_back((uint64_t)arg);
        return *this;
    }

    bool operator==(const Diagnostic& rhs) const;
}